

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_func_begin(string *func_name)

{
  long lVar1;
  undefined1 uVar2;
  ostream *poVar3;
  
  lVar1 = std::cout;
  *(uint *)(strcmp + *(long *)(std::cout + -0x18)) =
       *(uint *)(strcmp + *(long *)(std::cout + -0x18)) | 0x80;
  *(undefined8 *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(lVar1 + -0x18)) =
       0x1e;
  lVar1 = *(long *)(lVar1 + -0x18);
  if (*(char *)(lVar1 + 0x12c1a9) == '\0') {
    uVar2 = std::ios::widen((char)lVar1 + -0x38);
    *(undefined1 *)(lVar1 + 0x12c1a8) = uVar2;
    *(undefined1 *)(lVar1 + 0x12c1a9) = 1;
  }
  *(undefined1 *)(lVar1 + 0x12c1a8) = 0x23;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," begin ",7);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(func_name->_M_dataplus)._M_p,
                      func_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"############################",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void print_func_begin(const std::string& func_name) {
    std::cout.setf(std::ios::right);
    std::cout << std::setw(30) << std::setfill('#') << " begin " << func_name
              << " "
              << "############################" << std::endl;
}